

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O1

string * __thiscall
license::FullLicenseInfo::printForSign_abi_cxx11_
          (string *__return_storage_ptr__,FullLicenseInfo *this)

{
  ostream *poVar1;
  ostringstream oss;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  trim_copy(&local_1b0,&this->product);
  toupper_copy(&local_1d0,&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::ostream::operator<<((ostream *)local_190,0x17f);
  if (this->has_client_sig == true) {
    trim_copy(&local_1d0,&this->client_signature);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  if (this->has_versions == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"|",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (this->has_expiry == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"|",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->from_date)._M_dataplus._M_p,
                        (this->from_date)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"|",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->to_date)._M_dataplus._M_p,(this->to_date)._M_string_length);
  }
  if ((this->extra_data)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"|",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(this->extra_data)._M_dataplus._M_p,
               (this->extra_data)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string FullLicenseInfo::printForSign() const {
	ostringstream oss;
	oss << toupper_copy(trim_copy(this->product));
	oss << SHARED_RANDOM
	;
	if (has_client_sig) {
		oss << trim_copy(this->client_signature);
	}
	if (has_versions) {
		oss << "|" << this->from_sw_version << "-" << this->to_sw_version;
	}
	if (has_expiry) {
		oss << "|" << this->from_date << "|" << this->to_date;
	}
	if (this->extra_data.length() > 0) {
		oss << "|" << extra_data;
	}
#ifdef _DEBUG
	cout << "[" << oss.str() << "]" << endl;
#endif
	return oss.str();

}